

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# permutation.h
# Opt level: O2

ArrayIDIDFunc *
inverse_permutation<ArrayIDIDFunc>(ArrayIDIDFunc *__return_storage_ptr__,ArrayIDIDFunc *f)

{
  uint preimage_count;
  int *piVar1;
  int *piVar2;
  ulong uVar3;
  
  preimage_count = (f->super_ArrayIDFunc<int>).preimage_count_;
  ArrayIDFunc<int>::ArrayIDFunc(&__return_storage_ptr__->super_ArrayIDFunc<int>,preimage_count);
  __return_storage_ptr__->image_count_ = preimage_count;
  piVar1 = (f->super_ArrayIDFunc<int>).data_;
  piVar2 = (__return_storage_ptr__->super_ArrayIDFunc<int>).data_;
  for (uVar3 = 0; (~((int)preimage_count >> 0x1f) & preimage_count) != uVar3; uVar3 = uVar3 + 1) {
    piVar2[piVar1[uVar3]] = (int)uVar3;
  }
  return __return_storage_ptr__;
}

Assistant:

ArrayIDIDFunc inverse_permutation(const IDIDFunc& f)
{
    assert(is_permutation(f));

    int id_count = f.preimage_count();

    ArrayIDIDFunc inv_f(id_count, id_count);
    for (int i = 0; i < id_count; ++i)
        inv_f[f(i)] = i;
    return inv_f; // NVRO
}